

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonestack.h
# Opt level: O0

Error __thiscall
asmjit::v1_14::ZoneStack<asmjit::v1_14::RABlock_*>::append
          (ZoneStack<asmjit::v1_14::RABlock_*> *this,RABlock *item)

{
  undefined8 *puVar1;
  Error EVar2;
  undefined8 in_RSI;
  long *in_RDI;
  RABlock **ptr;
  Error _err;
  Block *block;
  char *in_stack_00000360;
  int in_stack_0000036c;
  char *in_stack_00000370;
  undefined8 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  long local_70;
  
  if (*in_RDI == 0) {
    DebugUtils::assertionFailed(in_stack_00000370,in_stack_0000036c,in_stack_00000360);
  }
  local_70 = in_RDI[2];
  if (local_70 + 0x1f8U < *(ulong *)(local_70 + 0x18)) {
    EVar2 = ZoneStackBase::_prepareBlock
                      ((ZoneStackBase *)
                       CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                       (uint32_t)((ulong)in_stack_ffffffffffffff80 >> 0x20),(size_t)in_RDI);
    if (EVar2 != 0) {
      return EVar2;
    }
    local_70 = in_RDI[2];
  }
  puVar1 = *(undefined8 **)(local_70 + 0x18);
  if ((undefined8 *)(local_70 + 0x20U) <= puVar1 && puVar1 <= (undefined8 *)(local_70 + 0x1f8U)) {
    *puVar1 = in_RSI;
    *(undefined8 **)(local_70 + 0x18) = puVar1 + 1;
    return 0;
  }
  DebugUtils::assertionFailed(in_stack_00000370,in_stack_0000036c,in_stack_00000360);
}

Assistant:

inline Error append(T item) noexcept {
    ASMJIT_ASSERT(isInitialized());
    Block* block = _block[kBlockIndexLast];

    if (!block->canAppend<T>()) {
      ASMJIT_PROPAGATE(_prepareBlock(kBlockIndexLast, kStartBlockIndex));
      block = _block[kBlockIndexLast];
    }

    T* ptr = block->end<T>();
    ASMJIT_ASSERT(ptr >= block->data<T>() && ptr <= block->data<T>() + (kNumBlockItems - 1));

    *ptr++ = item;
    block->setEnd(ptr);
    return kErrorOk;
  }